

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

_Bool get_name_keypress(char *buf,size_t buflen,size_t *curs,size_t *len,keypress keypress,
                       _Bool firsttime)

{
  unkuint9 Var1;
  size_t sVar2;
  keypress keypress_00;
  undefined1 local_4a;
  _Bool result;
  _Bool firsttime_local;
  size_t *len_local;
  size_t *curs_local;
  size_t buflen_local;
  char *buf_local;
  undefined4 uStack_14;
  keypress keypress_local;
  
  uStack_14 = keypress.code;
  if (uStack_14 == 0x2a) {
    sVar2 = player_random_name(buf,buflen);
    *len = sVar2;
    *curs = 0;
    local_4a = false;
  }
  else {
    Var1 = keypress._0_9_;
    keypress_00._9_3_ = 0;
    keypress_00.type = (int)Var1;
    keypress_00.code = (int)(Var1 >> 0x20);
    keypress_00.mods = (char)(Var1 >> 0x40);
    local_4a = askfor_aux_keypress(buf,buflen,curs,len,keypress_00,firsttime);
  }
  return local_4a;
}

Assistant:

static bool get_name_keypress(char *buf, size_t buflen, size_t *curs,
							  size_t *len, struct keypress keypress,
							  bool firsttime)
{
	bool result;

	switch (keypress.code)
	{
		case '*':
		{
			*len = player_random_name(buf, buflen);
			*curs = 0;
			result = false;
			break;
		}

		default:
		{
			result = askfor_aux_keypress(buf, buflen, curs, len, keypress,
										 firsttime);
			break;
		}
	}

	return result;
}